

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecoder::Init
          (SequentialAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  this->decoder_ = decoder;
  this->attribute_ =
       (PointAttribute *)
       (decoder->point_cloud_->attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[attribute_id]._M_t.
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t;
  this->attribute_id_ = attribute_id;
  return true;
}

Assistant:

bool SequentialAttributeDecoder::Init(PointCloudDecoder *decoder,
                                      int attribute_id) {
  decoder_ = decoder;
  attribute_ = decoder->point_cloud()->attribute(attribute_id);
  attribute_id_ = attribute_id;
  return true;
}